

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O2

void rw::ps2::registerNativeRaster(void)

{
  nativeRasterOffset =
       Raster::registerPlugin(0x40,0xa04,createNativeRaster,destroyNativeRaster,copyNativeRaster);
  Texture::registerPlugin(0,0x110,(Constructor)0x0,(Destructor)0x0,(CopyConstructor)0x0);
  Texture::registerPluginStream(0x110,readMipmap,writeMipmap,getSizeMipmap);
  return;
}

Assistant:

void
registerNativeRaster(void)
{
	nativeRasterOffset = Raster::registerPlugin(sizeof(Ps2Raster),
	                                            ID_RASTERPS2,
	                                            createNativeRaster,
	                                            destroyNativeRaster,
	                                            copyNativeRaster);

	Texture::registerPlugin(0, ID_SKYMIPMAP, nil, nil, nil);
	Texture::registerPluginStream(ID_SKYMIPMAP, readMipmap, writeMipmap, getSizeMipmap);
}